

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O0

void UpnpEventSubscribe_delete(UpnpEventSubscribe *q)

{
  s_UpnpEventSubscribe *p;
  UpnpEventSubscribe *q_local;
  
  if (q != (UpnpEventSubscribe *)0x0) {
    UpnpString_delete(q->m_PublisherUrl);
    q->m_PublisherUrl = (UpnpString *)0x0;
    UpnpString_delete(q->m_SID);
    q->m_SID = (UpnpString *)0x0;
    q->m_TimeOut = 0;
    q->m_ErrCode = 0;
    free(q);
  }
  return;
}

Assistant:

void UpnpEventSubscribe_delete(UpnpEventSubscribe *q)
{
	struct s_UpnpEventSubscribe *p = (struct s_UpnpEventSubscribe *)q;

	if (!p)
		return;

	UpnpString_delete(p->m_PublisherUrl);
	p->m_PublisherUrl = 0;
	UpnpString_delete(p->m_SID);
	p->m_SID = 0;
	p->m_TimeOut = 0;
	p->m_ErrCode = 0;

	free(p);
}